

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_data_source_get_data_format
                    (ma_data_source *pDataSource,ma_format *pFormat,ma_uint32 *pChannels,
                    ma_uint32 *pSampleRate,ma_channel *pChannelMap,size_t channelMapCap)

{
  ma_result mVar1;
  ma_uint32 sampleRate;
  ma_uint32 channels;
  ma_format format;
  ma_uint32 local_3c;
  ma_uint32 local_38;
  ma_format local_34;
  
  if (pFormat != (ma_format *)0x0) {
    *pFormat = ma_format_unknown;
  }
  if (pChannels != (ma_uint32 *)0x0) {
    *pChannels = 0;
  }
  if (pSampleRate != (ma_uint32 *)0x0) {
    *pSampleRate = 0;
  }
  if (channelMapCap != 0 && pChannelMap != (ma_channel *)0x0) {
    memset(pChannelMap,0,channelMapCap);
  }
  if (pDataSource == (ma_data_source *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else if (*(code **)(*pDataSource + 0x10) == (code *)0x0) {
    mVar1 = MA_NOT_IMPLEMENTED;
  }
  else {
    mVar1 = (**(code **)(*pDataSource + 0x10))
                      (pDataSource,&local_34,&local_38,&local_3c,pChannelMap,channelMapCap);
    if (mVar1 == MA_SUCCESS) {
      if (pFormat != (ma_format *)0x0) {
        *pFormat = local_34;
      }
      if (pChannels != (ma_uint32 *)0x0) {
        *pChannels = local_38;
      }
      mVar1 = MA_SUCCESS;
      if (pSampleRate != (ma_uint32 *)0x0) {
        *pSampleRate = local_3c;
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_get_data_format(ma_data_source* pDataSource, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;
    ma_result result;
    ma_format format;
    ma_uint32 channels;
    ma_uint32 sampleRate;

    /* Initialize to defaults for safety just in case the data source does not implement this callback. */
    if (pFormat != NULL) {
        *pFormat = ma_format_unknown;
    }
    if (pChannels != NULL) {
        *pChannels = 0;
    }
    if (pSampleRate != NULL) {
        *pSampleRate = 0;
    }
    if (pChannelMap != NULL) {
        MA_ZERO_MEMORY(pChannelMap, sizeof(*pChannelMap) * channelMapCap);
    }

    if (pDataSourceBase == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ASSERT(pDataSourceBase->vtable != NULL);

    if (pDataSourceBase->vtable->onGetDataFormat == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    result = pDataSourceBase->vtable->onGetDataFormat(pDataSource, &format, &channels, &sampleRate, pChannelMap, channelMapCap);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (pFormat != NULL) {
        *pFormat = format;
    }
    if (pChannels != NULL) {
        *pChannels = channels;
    }
    if (pSampleRate != NULL) {
        *pSampleRate = sampleRate;
    }

    /* Channel map was passed in directly to the callback. This is safe due to the channelMapCap parameter. */

    return MA_SUCCESS;
}